

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  RayHitK<4> *pRVar4;
  RayHitK<4> *pRVar5;
  RayHitK<4> *pRVar6;
  AccelData *pAVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  uint uVar30;
  undefined4 uVar31;
  size_t i;
  ulong uVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  ulong *puVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  vint4 ai;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 in_ZMM0 [64];
  vint4 ai_1;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  vint4 bi;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  uint uVar88;
  uint uVar89;
  vint4 ai_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar90;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar96;
  float fVar97;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  vint4 bi_1;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar122;
  float fVar123;
  vint4 bi_3;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar124;
  undefined1 auVar121 [64];
  float fVar125;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  vint4 bi_2;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar135;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  vint4 bi_4;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  vfloat<4> fmin;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1388 [8];
  float fStack_1380;
  float fStack_137c;
  ulong local_1378;
  ulong uStack_1370;
  undefined1 local_1328 [16];
  undefined1 local_12c8 [16];
  undefined1 local_12b8 [16];
  undefined1 local_12a8 [16];
  undefined1 local_1268 [8];
  float fStack_1260;
  float fStack_125c;
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  undefined1 local_1248 [8];
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  undefined1 local_1228 [8];
  float fStack_1220;
  float fStack_121c;
  undefined1 local_1208 [8];
  float fStack_1200;
  float fStack_11fc;
  float local_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  undefined1 local_1128 [3] [16];
  undefined4 local_10f8;
  undefined4 uStack_10f4;
  undefined4 uStack_10f0;
  undefined4 uStack_10ec;
  undefined1 local_10e8 [16];
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  uint local_1048;
  uint uStack_1044;
  uint uStack_1040;
  uint uStack_103c;
  undefined1 local_1038 [16];
  uint local_1028;
  uint uStack_1024;
  uint uStack_1020;
  uint uStack_101c;
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  uint local_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  undefined1 local_fc8 [16];
  uint local_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  ulong local_f78;
  undefined4 local_f70 [2];
  ulong local_f68 [487];
  undefined1 auVar107 [64];
  
  uVar29 = mm_lookupmask_ps._248_8_;
  uVar28 = mm_lookupmask_ps._240_8_;
  uVar27 = mm_lookupmask_ps._8_8_;
  uVar26 = mm_lookupmask_ps._0_8_;
  auVar137 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar138 = vpcmpeqd_avx(auVar137,(undefined1  [16])valid_i->field_0);
  uVar30 = vmovmskps_avx(auVar138);
  if (uVar30 != 0) {
    pAVar7 = This->ptr;
    uVar35 = (ulong)(uVar30 & 0xff);
    auVar23 = *(undefined1 (*) [16])ray;
    local_10c8 = *(float *)(ray + 0x10);
    auVar24 = *(undefined1 (*) [16])(ray + 0x10);
    local_10d8 = *(float *)(ray + 0x20);
    auVar25 = *(undefined1 (*) [16])(ray + 0x20);
    auVar139 = *(undefined1 (*) [16])(ray + 0x40);
    auVar108._8_4_ = 0x7fffffff;
    auVar108._0_8_ = 0x7fffffff7fffffff;
    auVar108._12_4_ = 0x7fffffff;
    auVar8 = vandps_avx(auVar108,auVar139);
    auVar91._8_4_ = 0x219392ef;
    auVar91._0_8_ = 0x219392ef219392ef;
    auVar91._12_4_ = 0x219392ef;
    auVar8 = vcmpps_avx(auVar8,auVar91,1);
    auVar10 = vblendvps_avx(auVar139,auVar91,auVar8);
    auVar8 = *(undefined1 (*) [16])(ray + 0x50);
    auVar94 = vandps_avx(auVar8,auVar108);
    auVar94 = vcmpps_avx(auVar94,auVar91,1);
    auVar11 = vblendvps_avx(auVar8,auVar91,auVar94);
    auVar94 = *(undefined1 (*) [16])(ray + 0x60);
    auVar9 = vandps_avx(auVar108,auVar94);
    auVar9 = vcmpps_avx(auVar9,auVar91,1);
    auVar9 = vblendvps_avx(auVar94,auVar91,auVar9);
    auVar91 = vrcpps_avx(auVar10);
    auVar109._8_4_ = 0x3f800000;
    auVar109._0_8_ = 0x3f8000003f800000;
    auVar109._12_4_ = 0x3f800000;
    auVar10 = vfnmadd213ps_fma(auVar10,auVar91,auVar109);
    auVar91 = vfmadd132ps_fma(auVar10,auVar91,auVar91);
    auVar10 = vrcpps_avx(auVar11);
    auVar11 = vfnmadd213ps_fma(auVar11,auVar10,auVar109);
    auVar11 = vfmadd132ps_fma(auVar11,auVar10,auVar10);
    auVar10 = vrcpps_avx(auVar9);
    auVar9 = vfnmadd213ps_fma(auVar9,auVar10,auVar109);
    auVar10 = vfmadd132ps_fma(auVar9,auVar10,auVar10);
    auVar109 = ZEXT816(0) << 0x20;
    auVar9 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar109);
    pRVar6 = ray + 0x80;
    auVar139 = vcmpps_avx(auVar139,auVar109,1);
    auVar93._8_4_ = 1;
    auVar93._0_8_ = 0x100000001;
    auVar93._12_4_ = 1;
    auVar139 = vandps_avx(auVar139,auVar93);
    auVar8 = vcmpps_avx(auVar8,auVar109,1);
    auVar99._8_4_ = 2;
    auVar99._0_8_ = 0x200000002;
    auVar99._12_4_ = 2;
    auVar8 = vandps_avx(auVar99,auVar8);
    local_10e8 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar109);
    auVar8 = vorps_avx(auVar8,auVar139);
    auVar139 = vcmpps_avx(auVar94,auVar109,1);
    auVar94._8_4_ = 4;
    auVar94._0_8_ = 0x400000004;
    auVar94._12_4_ = 4;
    auVar139 = vandps_avx(auVar139,auVar94);
    auVar137 = vpor_avx(auVar138 ^ auVar137,auVar139);
    local_1128[0] = vpor_avx(auVar137,auVar8);
    local_10b8 = *(float *)ray;
    fStack_10b4 = *(float *)(ray + 4);
    fStack_10b0 = *(float *)(ray + 8);
    fStack_10ac = *(float *)(ray + 0xc);
    auVar137._0_4_ = auVar91._0_4_ * -*(float *)ray;
    auVar137._4_4_ = auVar91._4_4_ * -*(float *)(ray + 4);
    auVar137._8_4_ = auVar91._8_4_ * -*(float *)(ray + 8);
    auVar137._12_4_ = auVar91._12_4_ * -*(float *)(ray + 0xc);
    fStack_10c4 = *(float *)(ray + 0x14);
    fStack_10c0 = *(float *)(ray + 0x18);
    fStack_10bc = *(float *)(ray + 0x1c);
    auVar138._0_4_ = auVar11._0_4_ * -local_10c8;
    auVar138._4_4_ = auVar11._4_4_ * -*(float *)(ray + 0x14);
    auVar138._8_4_ = auVar11._8_4_ * -*(float *)(ray + 0x18);
    auVar138._12_4_ = auVar11._12_4_ * -*(float *)(ray + 0x1c);
    fStack_10d4 = *(float *)(ray + 0x24);
    fStack_10d0 = *(float *)(ray + 0x28);
    fStack_10cc = *(float *)(ray + 0x2c);
    auVar139._0_4_ = auVar10._0_4_ * -local_10d8;
    auVar139._4_4_ = auVar10._4_4_ * -*(float *)(ray + 0x24);
    auVar139._8_4_ = auVar10._8_4_ * -*(float *)(ray + 0x28);
    auVar139._12_4_ = auVar10._12_4_ * -*(float *)(ray + 0x2c);
    local_1128[2]._0_8_ = mm_lookupmask_ps._0_8_;
    local_1128[2]._8_8_ = mm_lookupmask_ps._8_8_;
    local_1128[1]._0_8_ = mm_lookupmask_ps._240_8_;
    local_1128[1]._8_8_ = mm_lookupmask_ps._248_8_;
    local_10f8 = 0x7f800000;
    uStack_10f4 = 0x7f800000;
    uStack_10f0 = 0x7f800000;
    uStack_10ec = 0x7f800000;
    do {
      lVar40 = 0;
      for (uVar43 = uVar35; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
        lVar40 = lVar40 + 1;
      }
      uVar31 = *(undefined4 *)(local_1128[0] + lVar40 * 4);
      auVar46._4_4_ = uVar31;
      auVar46._0_4_ = uVar31;
      auVar46._8_4_ = uVar31;
      auVar46._12_4_ = uVar31;
      auVar100 = vpcmpeqd_avx(auVar46,local_1128[0]);
      uVar31 = vmovmskps_avx(auVar100);
      uVar35 = ~CONCAT44((int)((ulong)lVar40 >> 0x20),uVar31) & uVar35;
      auVar126._8_4_ = 0x7f800000;
      auVar126._0_8_ = 0x7f8000007f800000;
      auVar126._12_4_ = 0x7f800000;
      auVar8 = vblendvps_avx(auVar126,auVar23,auVar100);
      auVar94 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar94 = vminps_avx(auVar94,auVar8);
      auVar93 = vshufpd_avx(auVar94,auVar94,1);
      auVar8 = vblendvps_avx(auVar126,auVar24,auVar100);
      auVar94 = vminps_avx(auVar93,auVar94);
      auVar93 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar93,auVar8);
      auVar93 = vshufpd_avx(auVar8,auVar8,1);
      auVar8 = vminps_avx(auVar93,auVar8);
      auVar94 = vinsertps_avx(auVar94,auVar8,0x1c);
      auVar8 = vblendvps_avx(auVar126,auVar25,auVar100);
      auVar93 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar93,auVar8);
      auVar93 = vshufpd_avx(auVar8,auVar8,1);
      auVar8 = vminps_avx(auVar93,auVar8);
      auVar93 = vinsertps_avx(auVar94,auVar8,0x20);
      auVar71._8_4_ = 0xff800000;
      auVar71._0_8_ = 0xff800000ff800000;
      auVar71._12_4_ = 0xff800000;
      auVar8 = vblendvps_avx(auVar71,auVar23,auVar100);
      auVar94 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar94 = vmaxps_avx(auVar94,auVar8);
      auVar99 = vshufpd_avx(auVar94,auVar94,1);
      auVar8 = vblendvps_avx(auVar71,auVar24,auVar100);
      auVar94 = vmaxps_avx(auVar99,auVar94);
      auVar99 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar99,auVar8);
      auVar99 = vshufpd_avx(auVar8,auVar8,1);
      auVar8 = vmaxps_avx(auVar99,auVar8);
      auVar94 = vinsertps_avx(auVar94,auVar8,0x1c);
      auVar8 = vblendvps_avx(auVar71,auVar25,auVar100);
      auVar99 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar99,auVar8);
      auVar99 = vshufpd_avx(auVar8,auVar8,1);
      auVar8 = vmaxps_avx(auVar99,auVar8);
      auVar109 = vinsertps_avx(auVar94,auVar8,0x20);
      auVar8 = vblendvps_avx(auVar126,auVar91,auVar100);
      auVar94 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar94 = vminps_avx(auVar94,auVar8);
      auVar99 = vshufpd_avx(auVar94,auVar94,1);
      auVar8 = vblendvps_avx(auVar126,auVar11,auVar100);
      auVar94 = vminps_avx(auVar99,auVar94);
      auVar99 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar99,auVar8);
      auVar99 = vshufpd_avx(auVar8,auVar8,1);
      auVar8 = vminps_avx(auVar99,auVar8);
      auVar94 = vinsertps_avx(auVar94,auVar8,0x1c);
      auVar8 = vblendvps_avx(auVar126,auVar10,auVar100);
      auVar99 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vminps_avx(auVar99,auVar8);
      auVar99 = vshufpd_avx(auVar8,auVar8,1);
      auVar8 = vminps_avx(auVar99,auVar8);
      auVar46 = vinsertps_avx(auVar94,auVar8,0x20);
      auVar8 = vblendvps_avx(auVar71,auVar91,auVar100);
      auVar94 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar94 = vmaxps_avx(auVar94,auVar8);
      auVar99 = vshufpd_avx(auVar94,auVar94,1);
      auVar8 = vblendvps_avx(auVar71,auVar11,auVar100);
      auVar94 = vmaxps_avx(auVar99,auVar94);
      auVar99 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar99,auVar8);
      auVar99 = vshufpd_avx(auVar8,auVar8,1);
      auVar8 = vmaxps_avx(auVar99,auVar8);
      auVar94 = vinsertps_avx(auVar94,auVar8,0x1c);
      auVar8 = vblendvps_avx(auVar71,auVar10,auVar100);
      auVar99 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar8 = vmaxps_avx(auVar99,auVar8);
      auVar99 = vshufpd_avx(auVar8,auVar8,1);
      auVar8 = vmaxps_avx(auVar99,auVar8);
      auVar67 = vinsertps_avx(auVar94,auVar8,0x20);
      auVar8 = vblendvps_avx(auVar126,auVar9,auVar100);
      auVar94 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar126 = vminps_avx(auVar94,auVar8);
      auVar8 = vblendvps_avx(auVar71,local_10e8,auVar100);
      auVar121 = ZEXT1664(auVar8);
      auVar94 = vshufps_avx(auVar8,auVar8,0xb1);
      auVar68 = vmaxps_avx(auVar94,auVar8);
      auVar99 = vcmpps_avx(auVar46,_DAT_01f7aa10,5);
      auVar8 = vblendvps_avx(auVar67,auVar46,auVar99);
      auVar94 = vblendvps_avx(auVar93,auVar109,auVar99);
      auVar93 = vblendvps_avx(auVar109,auVar93,auVar99);
      auVar71 = vshufpd_avx(auVar68,auVar68,1);
      fVar92 = auVar8._0_4_;
      auVar109 = vmovshdup_avx(auVar8);
      uVar45 = (ulong)(auVar109._0_4_ < 0.0) << 4 | 0x20;
      auVar109 = vshufpd_avx(auVar8,auVar8,1);
      local_12c8 = vmaxps_avx(auVar71,auVar68);
      uVar44 = (ulong)(auVar109._0_4_ < 0.0) << 4 | 0x40;
      auVar99 = vblendvps_avx(auVar46,auVar67,auVar99);
      local_1208._0_4_ = auVar94._0_4_;
      local_1208._4_4_ = auVar94._4_4_;
      fStack_1200 = auVar94._8_4_;
      fStack_11fc = auVar94._12_4_;
      auVar67._0_4_ = fVar92 * (float)local_1208._0_4_;
      auVar67._4_4_ = auVar8._4_4_ * (float)local_1208._4_4_;
      auVar67._8_4_ = auVar8._8_4_ * fStack_1200;
      auVar67._12_4_ = auVar8._12_4_ * fStack_11fc;
      local_1388._0_4_ = auVar93._0_4_;
      local_1388._4_4_ = auVar93._4_4_;
      fStack_1380 = auVar93._8_4_;
      fStack_137c = auVar93._12_4_;
      local_fe8 = auVar99._0_4_;
      auVar79._0_4_ = local_fe8 * (float)local_1388._0_4_;
      auVar79._4_4_ = auVar99._4_4_ * (float)local_1388._4_4_;
      auVar79._8_4_ = auVar99._8_4_ * fStack_1380;
      auVar79._12_4_ = auVar99._12_4_ * fStack_137c;
      uVar43 = (ulong)(fVar92 < 0.0) * 0x10;
      local_f78 = *(ulong *)&pAVar7[1].bounds.bounds0.lower.field_0;
      local_f70[0] = 0;
      local_1208._4_4_ = fVar92;
      local_1208._0_4_ = fVar92;
      fStack_1200 = fVar92;
      fStack_11fc = fVar92;
      local_f98 = -auVar67._0_4_;
      fStack_f94 = -auVar67._0_4_;
      fStack_f90 = -auVar67._0_4_;
      fStack_f8c = -auVar67._0_4_;
      local_fa8 = vshufps_avx(auVar8,auVar8,0x55);
      auVar94 = vshufps_avx(auVar67,auVar67,0x55);
      uStack_fb0 = auVar94._8_4_ ^ 0x80000000;
      uStack_fac = auVar94._12_4_ ^ 0x80000000;
      local_fb8 = auVar94._0_4_ ^ 0x80000000;
      uStack_fb4 = auVar94._4_4_ ^ 0x80000000;
      local_fc8 = vshufps_avx(auVar8,auVar8,0xaa);
      auVar93 = vshufps_avx(auVar67,auVar67,0xaa);
      uStack_fd0 = auVar93._8_4_ ^ 0x80000000;
      uStack_fcc = auVar93._12_4_ ^ 0x80000000;
      local_fd8 = auVar93._0_4_ ^ 0x80000000;
      uStack_fd4 = auVar93._4_4_ ^ 0x80000000;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      local_ff8 = -auVar79._0_4_;
      fStack_ff4 = -auVar79._0_4_;
      fStack_ff0 = -auVar79._0_4_;
      fStack_fec = -auVar79._0_4_;
      local_1008 = vshufps_avx(auVar99,auVar99,0x55);
      uVar31 = auVar126._0_4_;
      auVar68._4_4_ = uVar31;
      auVar68._0_4_ = uVar31;
      auVar68._8_4_ = uVar31;
      auVar68._12_4_ = uVar31;
      auVar8 = vshufps_avx(auVar126,auVar126,0xaa);
      local_1018 = vminps_avx(auVar8,auVar68);
      auVar109 = vshufps_avx(auVar79,auVar79,0x55);
      uStack_1020 = auVar109._8_4_ ^ 0x80000000;
      uStack_101c = auVar109._12_4_ ^ 0x80000000;
      local_1028 = auVar109._0_4_ ^ 0x80000000;
      uStack_1024 = auVar109._4_4_ ^ 0x80000000;
      local_1038 = vshufps_avx(auVar99,auVar99,0xaa);
      auVar99 = vshufps_avx(auVar79,auVar79,0xaa);
      uStack_1040 = auVar99._8_4_ ^ 0x80000000;
      uStack_103c = auVar99._12_4_ ^ 0x80000000;
      local_1048 = auVar99._0_4_ ^ 0x80000000;
      uStack_1044 = auVar99._4_4_ ^ 0x80000000;
      auVar8._8_4_ = 0x7f800000;
      auVar8._0_8_ = 0x7f8000007f800000;
      auVar8._12_4_ = 0x7f800000;
      auVar8 = vblendvps_avx(auVar8,auVar9,auVar100);
      puVar42 = local_f68;
      local_1388._4_4_ = local_12c8._0_4_;
      local_1388._0_4_ = local_1388._4_4_;
      fStack_1380 = (float)local_1388._4_4_;
      fStack_137c = (float)local_1388._4_4_;
      do {
        uVar31 = (undefined4)puVar42[-1];
        auVar100._4_4_ = uVar31;
        auVar100._0_4_ = uVar31;
        auVar100._8_4_ = uVar31;
        auVar100._12_4_ = uVar31;
        auVar107 = ZEXT1664(auVar100);
        puVar42 = puVar42 + -2;
        auVar46 = vcmpps_avx(auVar100,auVar121._0_16_,1);
        if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar46[0xf] < '\0') {
          uVar37 = *puVar42;
          while ((uVar37 & 8) == 0) {
            auVar18._4_4_ = fStack_f94;
            auVar18._0_4_ = local_f98;
            auVar18._8_4_ = fStack_f90;
            auVar18._12_4_ = fStack_f8c;
            auVar46 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar43),auVar18,
                                      _local_1208);
            auVar119._8_4_ = uStack_fb0;
            auVar119._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
            auVar119._12_4_ = uStack_fac;
            auVar67 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar45),auVar119,
                                      local_fa8);
            auVar46 = vpmaxsd_avx(auVar46,auVar67);
            auVar17._8_4_ = uStack_fd0;
            auVar17._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
            auVar17._12_4_ = uStack_fcc;
            auVar67 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar44),auVar17,
                                      local_fc8);
            auVar67 = vpmaxsd_avx(auVar67,local_1018);
            local_f88 = vpmaxsd_avx(auVar46,auVar67);
            uVar32 = CONCAT44(auVar79._0_4_,auVar79._0_4_);
            auVar116._8_4_ = -auVar79._0_4_;
            auVar116._0_8_ = uVar32 ^ 0x8000000080000000;
            auVar116._12_4_ = -auVar79._0_4_;
            auVar16._4_4_ = local_fe8;
            auVar16._0_4_ = local_fe8;
            auVar16._8_4_ = local_fe8;
            auVar16._12_4_ = local_fe8;
            auVar46 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar43 ^ 0x10)),
                                      auVar116,auVar16);
            auVar113._8_4_ = uStack_1020;
            auVar113._0_8_ = auVar109._0_8_ ^ 0x8000000080000000;
            auVar113._12_4_ = uStack_101c;
            auVar67 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar45 ^ 0x10)),
                                      auVar113,local_1008);
            auVar46 = vpminsd_avx(auVar46,auVar67);
            auVar15._8_4_ = uStack_1040;
            auVar15._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
            auVar15._12_4_ = uStack_103c;
            auVar67 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar37 + 0x20 + (uVar44 ^ 0x10)),
                                      auVar15,local_1038);
            auVar67 = vpminsd_avx(auVar67,_local_1388);
            auVar46 = vpminsd_avx(auVar46,auVar67);
            auVar46 = vcmpps_avx(local_f88,auVar46,2);
            uVar30 = vmovmskps_avx(auVar46);
            if (uVar30 == 0) goto LAB_0050cc23;
            uVar39 = (ulong)(uVar30 & 0xff);
            auVar107 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            uVar36 = 0;
            uVar32 = 8;
            do {
              lVar40 = 0;
              for (uVar38 = uVar39; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                lVar40 = lVar40 + 1;
              }
              uVar31 = *(undefined4 *)(uVar37 + 0x20 + lVar40 * 4);
              auVar47._4_4_ = uVar31;
              auVar47._0_4_ = uVar31;
              auVar47._8_4_ = uVar31;
              auVar47._12_4_ = uVar31;
              auVar68 = vfmadd213ps_fma(auVar47,auVar91,auVar137);
              uVar31 = *(undefined4 *)(uVar37 + 0x40 + lVar40 * 4);
              auVar69._4_4_ = uVar31;
              auVar69._0_4_ = uVar31;
              auVar69._8_4_ = uVar31;
              auVar69._12_4_ = uVar31;
              auVar126 = vfmadd213ps_fma(auVar69,auVar11,auVar138);
              uVar31 = *(undefined4 *)(uVar37 + 0x60 + lVar40 * 4);
              auVar72._4_4_ = uVar31;
              auVar72._0_4_ = uVar31;
              auVar72._8_4_ = uVar31;
              auVar72._12_4_ = uVar31;
              auVar100 = vfmadd213ps_fma(auVar72,auVar10,auVar139);
              uVar31 = *(undefined4 *)(uVar37 + 0x30 + lVar40 * 4);
              auVar110._4_4_ = uVar31;
              auVar110._0_4_ = uVar31;
              auVar110._8_4_ = uVar31;
              auVar110._12_4_ = uVar31;
              auVar71 = vfmadd213ps_fma(auVar110,auVar91,auVar137);
              uVar31 = *(undefined4 *)(uVar37 + 0x50 + lVar40 * 4);
              auVar127._4_4_ = uVar31;
              auVar127._0_4_ = uVar31;
              auVar127._8_4_ = uVar31;
              auVar127._12_4_ = uVar31;
              auVar15 = vfmadd213ps_fma(auVar127,auVar11,auVar138);
              uVar31 = *(undefined4 *)(uVar37 + 0x70 + lVar40 * 4);
              auVar140._4_4_ = uVar31;
              auVar140._0_4_ = uVar31;
              auVar140._8_4_ = uVar31;
              auVar140._12_4_ = uVar31;
              auVar113 = vfmadd213ps_fma(auVar140,auVar10,auVar139);
              auVar46 = vpminsd_avx(auVar68,auVar71);
              auVar116 = auVar121._0_16_;
              auVar67 = vpminsd_avx(auVar126,auVar15);
              auVar46 = vpmaxsd_avx(auVar46,auVar67);
              auVar67 = vpminsd_avx(auVar100,auVar113);
              auVar67 = vpmaxsd_avx(auVar67,auVar8);
              auVar46 = vpmaxsd_avx(auVar46,auVar67);
              auVar121 = ZEXT1664(auVar116);
              auVar67 = vpmaxsd_avx(auVar68,auVar71);
              auVar68 = vpmaxsd_avx(auVar126,auVar15);
              auVar68 = vpminsd_avx(auVar67,auVar68);
              auVar67 = vpmaxsd_avx(auVar100,auVar113);
              auVar67 = vpminsd_avx(auVar67,auVar116);
              auVar67 = vpminsd_avx(auVar68,auVar67);
              auVar46 = vcmpps_avx(auVar46,auVar67,2);
              uVar38 = uVar32;
              if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar46[0xf] < '\0') {
                uVar31 = *(undefined4 *)(local_f88 + lVar40 * 4);
                auVar48._4_4_ = uVar31;
                auVar48._0_4_ = uVar31;
                auVar48._8_4_ = uVar31;
                auVar48._12_4_ = uVar31;
                uVar38 = *(ulong *)(uVar37 + lVar40 * 8);
                auVar67 = auVar107._0_16_;
                auVar46 = vcmpps_avx(auVar48,auVar67,1);
                if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar46 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar46 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar46[0xf]) {
                  *puVar42 = uVar38;
                  uVar38 = uVar32;
                }
                else {
                  if (uVar32 == 8) {
                    auVar107 = ZEXT1664(auVar48);
                    goto LAB_0050c240;
                  }
                  *puVar42 = uVar32;
                  auVar107 = ZEXT1664(auVar48);
                  auVar48 = auVar67;
                }
                uVar36 = uVar36 + 1;
                *(int *)(puVar42 + 1) = auVar48._0_4_;
                puVar42 = puVar42 + 2;
              }
LAB_0050c240:
              uVar39 = uVar39 - 1 & uVar39;
              uVar32 = uVar38;
            } while (uVar39 != 0);
            if (uVar38 == 8) goto LAB_0050cc23;
            uVar37 = uVar38;
            if (1 < uVar36) {
              puVar1 = puVar42 + -4;
              puVar2 = puVar42 + -2;
              if ((uint)puVar42[-3] < (uint)puVar42[-1]) {
                local_1378 = *puVar1;
                uStack_1370 = puVar42[-3];
                *(int *)(puVar42 + -3) = (int)puVar42[-1];
                *puVar1 = *puVar2;
                *puVar2 = local_1378;
                *(undefined4 *)(puVar42 + -1) = (undefined4)uStack_1370;
              }
              if (uVar36 != 2) {
                puVar3 = puVar42 + -6;
                uVar30 = (uint)puVar42[-5];
                if (uVar30 < (uint)puVar42[-1]) {
                  local_1378 = *puVar3;
                  uStack_1370 = puVar42[-5];
                  *(int *)(puVar42 + -5) = (int)puVar42[-1];
                  *puVar3 = *puVar2;
                  *puVar2 = local_1378;
                  *(undefined4 *)(puVar42 + -1) = (undefined4)uStack_1370;
                  uVar30 = (uint)puVar42[-5];
                }
                if (uVar30 < (uint)puVar42[-3]) {
                  local_1378 = *puVar3;
                  uStack_1370 = puVar42[-5];
                  *(int *)(puVar42 + -5) = (int)puVar42[-3];
                  *puVar3 = *puVar1;
                  *puVar1 = local_1378;
                  *(undefined4 *)(puVar42 + -3) = (undefined4)uStack_1370;
                }
              }
            }
          }
          local_10a8 = auVar121._0_16_;
          auVar46 = vcmpps_avx(local_10a8,auVar107._0_16_,6);
          if ((((auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar46[0xf] < '\0') {
            uVar32 = (ulong)((uint)uVar37 & 0xf);
            if (uVar32 != 8) {
              pRVar4 = ray + 0x50;
              auVar67 = *(undefined1 (*) [16])(ray + 0x60);
              pRVar5 = ray + 0x40;
              lVar40 = (uVar37 & 0xfffffffffffffff0) + 0xc0;
              lVar34 = 0;
              do {
                lVar41 = lVar34 * 0xe0 + (uVar37 & 0xfffffffffffffff0);
                lVar33 = 0;
                do {
                  uVar30 = *(uint *)(lVar40 + lVar33 * 4);
                  if ((ulong)uVar30 == 0xffffffff) break;
                  fVar92 = *(float *)(lVar40 + -0xc0 + lVar33 * 4);
                  auVar95._4_4_ = fVar92;
                  auVar95._0_4_ = fVar92;
                  auVar95._8_4_ = fVar92;
                  auVar95._12_4_ = fVar92;
                  fVar122 = *(float *)(lVar40 + -0xb0 + lVar33 * 4);
                  auVar141._4_4_ = fVar122;
                  auVar141._0_4_ = fVar122;
                  auVar141._8_4_ = fVar122;
                  auVar141._12_4_ = fVar122;
                  fVar123 = *(float *)(lVar40 + -0xa0 + lVar33 * 4);
                  auVar128._4_4_ = fVar123;
                  auVar128._0_4_ = fVar123;
                  auVar128._8_4_ = fVar123;
                  auVar128._12_4_ = fVar123;
                  local_1228._4_4_ = *(float *)(lVar40 + -0x90 + lVar33 * 4);
                  local_1238._4_4_ = *(float *)(lVar40 + -0x80 + lVar33 * 4);
                  local_1388._4_4_ = *(float *)(lVar40 + -0x70 + lVar33 * 4);
                  local_1388._0_4_ = local_1388._4_4_;
                  fStack_1380 = (float)local_1388._4_4_;
                  fStack_137c = (float)local_1388._4_4_;
                  local_12a8._4_4_ = *(undefined4 *)(lVar40 + -0x60 + lVar33 * 4);
                  local_12a8._0_4_ = local_12a8._4_4_;
                  local_12a8._8_4_ = local_12a8._4_4_;
                  local_12a8._12_4_ = local_12a8._4_4_;
                  local_12b8._4_4_ = *(undefined4 *)(lVar40 + -0x50 + lVar33 * 4);
                  local_12b8._0_4_ = local_12b8._4_4_;
                  local_12b8._8_4_ = local_12b8._4_4_;
                  local_12b8._12_4_ = local_12b8._4_4_;
                  local_1328._4_4_ = *(undefined4 *)(lVar40 + -0x40 + lVar33 * 4);
                  local_1328._0_4_ = local_1328._4_4_;
                  local_1328._8_4_ = local_1328._4_4_;
                  local_1328._12_4_ = local_1328._4_4_;
                  local_1248._4_4_ = *(float *)(lVar40 + -0x30 + lVar33 * 4);
                  local_1258._4_4_ = *(float *)(lVar40 + -0x20 + lVar33 * 4);
                  local_1268._4_4_ = *(float *)(lVar40 + -0x10 + lVar33 * 4);
                  local_1378 = *(ulong *)(lVar41 + 0xd0);
                  uStack_1370 = *(undefined8 *)(lVar41 + 0xd8);
                  local_1228._0_4_ = local_1228._4_4_;
                  fStack_1220 = (float)local_1228._4_4_;
                  fStack_121c = (float)local_1228._4_4_;
                  fVar96 = fVar92 - (float)local_1228._4_4_;
                  local_1058._4_4_ = fVar96;
                  local_1058._0_4_ = fVar96;
                  local_1058._8_4_ = fVar96;
                  local_1058._12_4_ = fVar96;
                  local_1238._0_4_ = local_1238._4_4_;
                  fStack_1230 = (float)local_1238._4_4_;
                  fStack_122c = (float)local_1238._4_4_;
                  fVar97 = fVar122 - (float)local_1238._4_4_;
                  local_1258._0_4_ = local_1258._4_4_;
                  fStack_1250 = (float)local_1258._4_4_;
                  fStack_124c = (float)local_1258._4_4_;
                  fVar122 = (float)local_1258._4_4_ - fVar122;
                  fVar96 = fVar122 * fVar96;
                  auVar111._4_4_ = fVar122;
                  auVar111._0_4_ = fVar122;
                  auVar111._8_4_ = fVar122;
                  auVar111._12_4_ = fVar122;
                  local_1268._0_4_ = local_1268._4_4_;
                  fStack_1260 = (float)local_1268._4_4_;
                  fStack_125c = (float)local_1268._4_4_;
                  fVar98 = (float)local_1268._4_4_ - fVar123;
                  auVar117._4_4_ = fVar98;
                  auVar117._0_4_ = fVar98;
                  auVar117._8_4_ = fVar98;
                  auVar117._12_4_ = fVar98;
                  fVar122 = fVar98 * fVar97;
                  auVar73._4_4_ = fVar122;
                  auVar73._0_4_ = fVar122;
                  auVar73._8_4_ = fVar122;
                  auVar73._12_4_ = fVar122;
                  fVar123 = fVar123 - (float)local_1388._4_4_;
                  local_1068._4_4_ = fVar123;
                  local_1068._0_4_ = fVar123;
                  local_1068._8_4_ = fVar123;
                  local_1068._12_4_ = fVar123;
                  auVar113 = vfmsub231ps_fma(auVar73,auVar111,local_1068);
                  local_1248._0_4_ = local_1248._4_4_;
                  fStack_1240 = (float)local_1248._4_4_;
                  fStack_123c = (float)local_1248._4_4_;
                  fVar92 = (float)local_1248._4_4_ - fVar92;
                  fVar122 = fVar123 * fVar92;
                  auVar101._4_4_ = fVar122;
                  auVar101._0_4_ = fVar122;
                  auVar101._8_4_ = fVar122;
                  auVar101._12_4_ = fVar122;
                  auVar116 = vfmsub231ps_fma(auVar101,auVar117,local_1058);
                  local_1098 = vsubps_avx(auVar95,*(undefined1 (*) [16])ray);
                  auVar126 = vsubps_avx(auVar141,*(undefined1 (*) [16])(ray + 0x10));
                  auVar100 = vsubps_avx(auVar128,*(undefined1 (*) [16])(ray + 0x20));
                  fVar125 = auVar67._0_4_;
                  auVar142._0_4_ = fVar125 * local_1098._0_4_;
                  fVar131 = auVar67._4_4_;
                  auVar142._4_4_ = fVar131 * local_1098._4_4_;
                  fVar133 = auVar67._8_4_;
                  auVar142._8_4_ = fVar133 * local_1098._8_4_;
                  fVar135 = auVar67._12_4_;
                  auVar142._12_4_ = fVar135 * local_1098._12_4_;
                  local_1078 = vfmsub231ps_fma(auVar142,auVar100,*(undefined1 (*) [16])pRVar5);
                  fVar122 = (float)*(undefined8 *)pRVar5;
                  auVar49._0_4_ = auVar126._0_4_ * fVar122;
                  fVar124 = (float)((ulong)*(undefined8 *)pRVar5 >> 0x20);
                  auVar49._4_4_ = auVar126._4_4_ * fVar124;
                  fVar12 = (float)*(undefined8 *)(ray + 0x48);
                  auVar49._8_4_ = auVar126._8_4_ * fVar12;
                  fVar13 = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
                  auVar49._12_4_ = auVar126._12_4_ * fVar13;
                  local_1088 = vfmsub231ps_fma(auVar49,local_1098,*(undefined1 (*) [16])pRVar4);
                  auVar118._0_4_ = fVar98 * local_1088._0_4_;
                  auVar118._4_4_ = fVar98 * local_1088._4_4_;
                  auVar118._8_4_ = fVar98 * local_1088._8_4_;
                  auVar118._12_4_ = fVar98 * local_1088._12_4_;
                  auVar68 = vfmadd231ps_fma(auVar118,local_1078,auVar111);
                  auVar50._4_4_ = fVar97;
                  auVar50._0_4_ = fVar97;
                  auVar50._8_4_ = fVar97;
                  auVar50._12_4_ = fVar97;
                  auVar80._4_4_ = fVar92;
                  auVar80._0_4_ = fVar92;
                  auVar80._8_4_ = fVar92;
                  auVar80._12_4_ = fVar92;
                  auVar143._4_4_ = fVar96;
                  auVar143._0_4_ = fVar96;
                  auVar143._8_4_ = fVar96;
                  auVar143._12_4_ = fVar96;
                  auVar16 = vfmsub231ps_fma(auVar143,auVar80,auVar50);
                  fVar92 = (float)*(undefined8 *)pRVar4;
                  auVar70._0_4_ = fVar92 * auVar100._0_4_;
                  fVar96 = (float)((ulong)*(undefined8 *)pRVar4 >> 0x20);
                  auVar70._4_4_ = fVar96 * auVar100._4_4_;
                  fVar97 = (float)*(undefined8 *)(ray + 0x58);
                  auVar70._8_4_ = fVar97 * auVar100._8_4_;
                  fVar98 = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
                  auVar70._12_4_ = fVar98 * auVar100._12_4_;
                  auVar17 = vfmsub231ps_fma(auVar70,auVar126,auVar67);
                  auVar71 = vfmadd231ps_fma(auVar68,auVar17,auVar80);
                  auVar129._0_4_ = auVar16._0_4_ * fVar125;
                  auVar129._4_4_ = auVar16._4_4_ * fVar131;
                  auVar129._8_4_ = auVar16._8_4_ * fVar133;
                  auVar129._12_4_ = auVar16._12_4_ * fVar135;
                  auVar68 = vfmadd231ps_fma(auVar129,auVar116,*(undefined1 (*) [16])pRVar4);
                  auVar15 = vfmadd231ps_fma(auVar68,*(undefined1 (*) [16])pRVar5,auVar113);
                  auVar19._8_4_ = 0x80000000;
                  auVar19._0_8_ = 0x8000000080000000;
                  auVar19._12_4_ = 0x80000000;
                  auVar68 = vandps_avx(auVar15,auVar19);
                  uVar88 = auVar68._0_4_;
                  auVar144._0_4_ = (float)(auVar71._0_4_ ^ uVar88);
                  uVar89 = auVar68._4_4_;
                  auVar144._4_4_ = (float)(auVar71._4_4_ ^ uVar89);
                  uVar90 = auVar68._8_4_;
                  auVar144._8_4_ = (float)(auVar71._8_4_ ^ uVar90);
                  uVar14 = auVar68._12_4_;
                  auVar144._12_4_ = (float)(auVar71._12_4_ ^ uVar14);
                  auVar119 = ZEXT816(0) << 0x20;
                  auVar68 = vcmpps_avx(auVar144,auVar119,5);
                  auVar71 = auVar46 & auVar68;
                  local_1198 = (float)*(undefined8 *)(ray + 0x30);
                  fStack_1194 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
                  fStack_1190 = (float)*(undefined8 *)(ray + 0x38);
                  fStack_118c = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
                  if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar71[0xf] < '\0') {
                    auVar68 = vandps_avx(auVar68,auVar46);
                    auVar53._0_4_ = local_1088._0_4_ * fVar123;
                    auVar53._4_4_ = local_1088._4_4_ * fVar123;
                    auVar53._8_4_ = local_1088._8_4_ * fVar123;
                    auVar53._12_4_ = local_1088._12_4_ * fVar123;
                    auVar71 = vfmadd132ps_fma(auVar50,auVar53,local_1078);
                    auVar71 = vfmadd213ps_fma(local_1058,auVar17,auVar71);
                    auVar103._0_4_ = (float)(uVar88 ^ auVar71._0_4_);
                    auVar103._4_4_ = (float)(uVar89 ^ auVar71._4_4_);
                    auVar103._8_4_ = (float)(uVar90 ^ auVar71._8_4_);
                    auVar103._12_4_ = (float)(uVar14 ^ auVar71._12_4_);
                    auVar71 = vcmpps_avx(auVar103,auVar119,5);
                    auVar17 = auVar71 & auVar68;
                    if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar17[0xf] < '\0') {
                      auVar17 = vandps_avx(auVar15,auVar108);
                      auVar68 = vandps_avx(auVar68,auVar71);
                      auVar71 = vsubps_avx(auVar17,auVar144);
                      auVar71 = vcmpps_avx(auVar71,auVar103,5);
                      auVar18 = auVar71 & auVar68;
                      if ((((auVar18 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar18 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar18[0xf] < '\0') {
                        auVar68 = vandps_avx(auVar68,auVar71);
                        auVar54._0_4_ = auVar100._0_4_ * auVar16._0_4_;
                        auVar54._4_4_ = auVar100._4_4_ * auVar16._4_4_;
                        auVar54._8_4_ = auVar100._8_4_ * auVar16._8_4_;
                        auVar54._12_4_ = auVar100._12_4_ * auVar16._12_4_;
                        auVar126 = vfmadd132ps_fma(auVar126,auVar54,auVar116);
                        auVar126 = vfmadd132ps_fma(local_1098,auVar126,auVar113);
                        auVar55._0_4_ = (float)(uVar88 ^ auVar126._0_4_);
                        auVar55._4_4_ = (float)(uVar89 ^ auVar126._4_4_);
                        auVar55._8_4_ = (float)(uVar90 ^ auVar126._8_4_);
                        auVar55._12_4_ = (float)(uVar14 ^ auVar126._12_4_);
                        auVar75._0_4_ = auVar17._0_4_ * local_1198;
                        auVar75._4_4_ = auVar17._4_4_ * fStack_1194;
                        auVar75._8_4_ = auVar17._8_4_ * fStack_1190;
                        auVar75._12_4_ = auVar17._12_4_ * fStack_118c;
                        auVar82._0_4_ = auVar17._0_4_ * *(float *)pRVar6;
                        auVar82._4_4_ = auVar17._4_4_ * *(float *)(ray + 0x84);
                        auVar82._8_4_ = auVar17._8_4_ * *(float *)(ray + 0x88);
                        auVar82._12_4_ = auVar17._12_4_ * *(float *)(ray + 0x8c);
                        auVar126 = vcmpps_avx(auVar75,auVar55,1);
                        auVar100 = vcmpps_avx(auVar55,auVar82,2);
                        auVar126 = vandps_avx(auVar126,auVar100);
                        auVar100 = auVar68 & auVar126;
                        if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar100[0xf] < '\0') {
                          auVar68 = vandps_avx(auVar126,auVar68);
                          auVar126 = vcmpps_avx(auVar15,auVar119,4);
                          auVar100 = auVar126 & auVar68;
                          if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar100 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar100[0xf] < '\0') {
                            uVar88 = ((context->scene->geometries).items[uVar30].ptr)->mask;
                            auVar83._4_4_ = uVar88;
                            auVar83._0_4_ = uVar88;
                            auVar83._8_4_ = uVar88;
                            auVar83._12_4_ = uVar88;
                            auVar68 = vandps_avx(auVar68,auVar126);
                            auVar126 = vpand_avx(auVar83,*(undefined1 (*) [16])(ray + 0x90));
                            auVar126 = vpcmpeqd_avx(auVar119,auVar126);
                            auVar100 = auVar68 & ~auVar126;
                            if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0 ||
                                 (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 ) || (auVar100 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar100[0xf] < '\0') {
                              auVar100 = vrcpps_avx(auVar17);
                              auVar114._8_4_ = 0x3f800000;
                              auVar114._0_8_ = 0x3f8000003f800000;
                              auVar114._12_4_ = 0x3f800000;
                              auVar71 = vfnmadd213ps_fma(auVar17,auVar100,auVar114);
                              auVar100 = vfmadd132ps_fma(auVar71,auVar100,auVar100);
                              fVar123 = auVar100._0_4_;
                              auVar84._0_4_ = fVar123 * auVar103._0_4_;
                              fVar132 = auVar100._4_4_;
                              auVar84._4_4_ = fVar132 * auVar103._4_4_;
                              fVar134 = auVar100._8_4_;
                              auVar84._8_4_ = fVar134 * auVar103._8_4_;
                              fVar136 = auVar100._12_4_;
                              auVar84._12_4_ = fVar136 * auVar103._12_4_;
                              auVar100 = vminps_avx(auVar84,auVar114);
                              auVar71 = vsubps_avx(auVar114,auVar100);
                              auVar22._8_8_ = uVar27;
                              auVar22._0_8_ = uVar26;
                              auVar100 = vblendvps_avx(auVar100,auVar71,auVar22);
                              auVar126 = vandnps_avx(auVar126,auVar68);
                              auVar76._0_4_ = fVar123 * auVar144._0_4_;
                              auVar76._4_4_ = fVar132 * auVar144._4_4_;
                              auVar76._8_4_ = fVar134 * auVar144._8_4_;
                              auVar76._12_4_ = fVar136 * auVar144._12_4_;
                              auVar68 = vminps_avx(auVar76,auVar114);
                              auVar71 = vsubps_avx(auVar114,auVar68);
                              auVar71 = vblendvps_avx(auVar68,auVar71,auVar22);
                              auVar56._0_4_ = fVar123 * auVar55._0_4_;
                              auVar56._4_4_ = fVar132 * auVar55._4_4_;
                              auVar56._8_4_ = fVar134 * auVar55._8_4_;
                              auVar56._12_4_ = fVar136 * auVar55._12_4_;
                              uVar31 = *(undefined4 *)((long)&local_1378 + lVar33 * 4);
                              auVar104._4_4_ = uVar31;
                              auVar104._0_4_ = uVar31;
                              auVar104._8_4_ = uVar31;
                              auVar104._12_4_ = uVar31;
                              auVar68 = vmaskmovps_avx(auVar126,auVar56);
                              *(undefined1 (*) [16])pRVar6 = auVar68;
                              auVar68 = vmaskmovps_avx(auVar126,auVar113);
                              *(undefined1 (*) [16])(ray + 0xc0) = auVar68;
                              auVar68 = vmaskmovps_avx(auVar126,auVar116);
                              *(undefined1 (*) [16])(ray + 0xd0) = auVar68;
                              auVar68 = vmaskmovps_avx(auVar126,auVar16);
                              *(undefined1 (*) [16])(ray + 0xe0) = auVar68;
                              auVar68 = vmaskmovps_avx(auVar126,auVar71);
                              *(undefined1 (*) [16])(ray + 0xf0) = auVar68;
                              auVar68 = vmaskmovps_avx(auVar126,auVar100);
                              *(undefined1 (*) [16])(ray + 0x100) = auVar68;
                              auVar68 = vmaskmovps_avx(auVar126,auVar104);
                              *(undefined1 (*) [16])(ray + 0x110) = auVar68;
                              auVar57._4_4_ = uVar30;
                              auVar57._0_4_ = uVar30;
                              auVar57._8_4_ = uVar30;
                              auVar57._12_4_ = uVar30;
                              auVar68 = vmaskmovps_avx(auVar126,auVar57);
                              *(undefined1 (*) [16])(ray + 0x120) = auVar68;
                              uVar30 = context->user->instID[0];
                              auVar58._4_4_ = uVar30;
                              auVar58._0_4_ = uVar30;
                              auVar58._8_4_ = uVar30;
                              auVar58._12_4_ = uVar30;
                              auVar68 = vmaskmovps_avx(auVar126,auVar58);
                              *(undefined1 (*) [16])(ray + 0x130) = auVar68;
                              uVar30 = context->user->instPrimID[0];
                              auVar59._4_4_ = uVar30;
                              auVar59._0_4_ = uVar30;
                              auVar59._8_4_ = uVar30;
                              auVar59._12_4_ = uVar30;
                              auVar68 = vmaskmovps_avx(auVar126,auVar59);
                              *(undefined1 (*) [16])(ray + 0x140) = auVar68;
                            }
                          }
                        }
                      }
                    }
                  }
                  auVar126 = vsubps_avx(local_12a8,_local_1248);
                  auVar100 = vsubps_avx(local_12b8,_local_1258);
                  auVar71 = vsubps_avx(local_1328,_local_1268);
                  auVar15 = vsubps_avx(_local_1228,local_12a8);
                  auVar68 = vsubps_avx(_local_1238,local_12b8);
                  auVar113 = vsubps_avx(_local_1388,local_1328);
                  auVar51._0_4_ = auVar100._0_4_ * auVar113._0_4_;
                  auVar51._4_4_ = auVar100._4_4_ * auVar113._4_4_;
                  auVar51._8_4_ = auVar100._8_4_ * auVar113._8_4_;
                  auVar51._12_4_ = auVar100._12_4_ * auVar113._12_4_;
                  auVar18 = vfmsub231ps_fma(auVar51,auVar68,auVar71);
                  auVar112._0_4_ = auVar15._0_4_ * auVar71._0_4_;
                  auVar112._4_4_ = auVar15._4_4_ * auVar71._4_4_;
                  auVar112._8_4_ = auVar15._8_4_ * auVar71._8_4_;
                  auVar112._12_4_ = auVar15._12_4_ * auVar71._12_4_;
                  auVar47 = vfmsub231ps_fma(auVar112,auVar113,auVar126);
                  auVar81._0_4_ = auVar126._0_4_ * auVar68._0_4_;
                  auVar81._4_4_ = auVar126._4_4_ * auVar68._4_4_;
                  auVar81._8_4_ = auVar126._8_4_ * auVar68._8_4_;
                  auVar81._12_4_ = auVar126._12_4_ * auVar68._12_4_;
                  auVar69 = vfmsub231ps_fma(auVar81,auVar15,auVar100);
                  auVar116 = vsubps_avx(local_12a8,*(undefined1 (*) [16])ray);
                  auVar16 = vsubps_avx(local_12b8,*(undefined1 (*) [16])(ray + 0x10));
                  auVar17 = vsubps_avx(local_1328,*(undefined1 (*) [16])(ray + 0x20));
                  auVar120._0_4_ = fVar92 * auVar17._0_4_;
                  auVar120._4_4_ = fVar96 * auVar17._4_4_;
                  auVar120._8_4_ = fVar97 * auVar17._8_4_;
                  auVar120._12_4_ = fVar98 * auVar17._12_4_;
                  auVar72 = vfmsub231ps_fma(auVar120,auVar16,auVar67);
                  auVar74._0_4_ = fVar125 * auVar116._0_4_;
                  auVar74._4_4_ = fVar131 * auVar116._4_4_;
                  auVar74._8_4_ = fVar133 * auVar116._8_4_;
                  auVar74._12_4_ = fVar135 * auVar116._12_4_;
                  auVar110 = vfmsub231ps_fma(auVar74,auVar17,*(undefined1 (*) [16])pRVar5);
                  auVar102._0_4_ = auVar16._0_4_ * fVar122;
                  auVar102._4_4_ = auVar16._4_4_ * fVar124;
                  auVar102._8_4_ = auVar16._8_4_ * fVar12;
                  auVar102._12_4_ = auVar16._12_4_ * fVar13;
                  auVar127 = vfmsub231ps_fma(auVar102,auVar116,*(undefined1 (*) [16])pRVar4);
                  auVar130._0_4_ = fVar125 * auVar69._0_4_;
                  auVar130._4_4_ = fVar131 * auVar69._4_4_;
                  auVar130._8_4_ = fVar133 * auVar69._8_4_;
                  auVar130._12_4_ = fVar135 * auVar69._12_4_;
                  auVar119 = vfmadd231ps_fma(auVar130,auVar47,*(undefined1 (*) [16])pRVar4);
                  auVar119 = vfmadd231ps_fma(auVar119,*(undefined1 (*) [16])pRVar5,auVar18);
                  auVar52._0_4_ = auVar127._0_4_ * auVar113._0_4_;
                  auVar52._4_4_ = auVar127._4_4_ * auVar113._4_4_;
                  auVar52._8_4_ = auVar127._8_4_ * auVar113._8_4_;
                  auVar52._12_4_ = auVar127._12_4_ * auVar113._12_4_;
                  auVar113 = vfmadd231ps_fma(auVar52,auVar110,auVar68);
                  auVar20._8_4_ = 0x80000000;
                  auVar20._0_8_ = 0x8000000080000000;
                  auVar20._12_4_ = 0x80000000;
                  auVar68 = vandps_avx(auVar119,auVar20);
                  auVar15 = vfmadd231ps_fma(auVar113,auVar72,auVar15);
                  uVar30 = auVar68._0_4_;
                  auVar145._0_4_ = (float)(uVar30 ^ auVar15._0_4_);
                  uVar88 = auVar68._4_4_;
                  auVar145._4_4_ = (float)(uVar88 ^ auVar15._4_4_);
                  uVar89 = auVar68._8_4_;
                  auVar145._8_4_ = (float)(uVar89 ^ auVar15._8_4_);
                  uVar90 = auVar68._12_4_;
                  auVar145._12_4_ = (float)(uVar90 ^ auVar15._12_4_);
                  auVar113 = ZEXT816(0) << 0x20;
                  auVar68 = vcmpps_avx(auVar145,_DAT_01f7aa10,5);
                  auVar15 = auVar46 & auVar68;
                  if ((((auVar15 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar15 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar15[0xf] < '\0') {
                    auVar68 = vandps_avx(auVar68,auVar46);
                    auVar60._0_4_ = auVar127._0_4_ * auVar71._0_4_;
                    auVar60._4_4_ = auVar127._4_4_ * auVar71._4_4_;
                    auVar60._8_4_ = auVar127._8_4_ * auVar71._8_4_;
                    auVar60._12_4_ = auVar127._12_4_ * auVar71._12_4_;
                    auVar100 = vfmadd213ps_fma(auVar100,auVar110,auVar60);
                    auVar126 = vfmadd213ps_fma(auVar126,auVar72,auVar100);
                    auVar105._0_4_ = (float)(uVar30 ^ auVar126._0_4_);
                    auVar105._4_4_ = (float)(uVar88 ^ auVar126._4_4_);
                    auVar105._8_4_ = (float)(uVar89 ^ auVar126._8_4_);
                    auVar105._12_4_ = (float)(uVar90 ^ auVar126._12_4_);
                    auVar126 = vcmpps_avx(auVar105,auVar113,5);
                    auVar100 = auVar126 & auVar68;
                    if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar100 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar100 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar100[0xf] < '\0') {
                      auVar100 = vandps_avx(auVar119,auVar108);
                      auVar68 = vandps_avx(auVar68,auVar126);
                      auVar126 = vsubps_avx(auVar100,auVar145);
                      auVar126 = vcmpps_avx(auVar126,auVar105,5);
                      auVar71 = auVar126 & auVar68;
                      if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar71[0xf] < '\0') {
                        auVar68 = vandps_avx(auVar68,auVar126);
                        auVar61._0_4_ = auVar17._0_4_ * auVar69._0_4_;
                        auVar61._4_4_ = auVar17._4_4_ * auVar69._4_4_;
                        auVar61._8_4_ = auVar17._8_4_ * auVar69._8_4_;
                        auVar61._12_4_ = auVar17._12_4_ * auVar69._12_4_;
                        auVar126 = vfmadd132ps_fma(auVar16,auVar61,auVar47);
                        auVar126 = vfmadd132ps_fma(auVar116,auVar126,auVar18);
                        auVar62._0_4_ = (float)(uVar30 ^ auVar126._0_4_);
                        auVar62._4_4_ = (float)(uVar88 ^ auVar126._4_4_);
                        auVar62._8_4_ = (float)(uVar89 ^ auVar126._8_4_);
                        auVar62._12_4_ = (float)(uVar90 ^ auVar126._12_4_);
                        auVar77._0_4_ = auVar100._0_4_ * local_1198;
                        auVar77._4_4_ = auVar100._4_4_ * fStack_1194;
                        auVar77._8_4_ = auVar100._8_4_ * fStack_1190;
                        auVar77._12_4_ = auVar100._12_4_ * fStack_118c;
                        auVar85._0_4_ = auVar100._0_4_ * *(float *)pRVar6;
                        auVar85._4_4_ = auVar100._4_4_ * *(float *)(ray + 0x84);
                        auVar85._8_4_ = auVar100._8_4_ * *(float *)(ray + 0x88);
                        auVar85._12_4_ = auVar100._12_4_ * *(float *)(ray + 0x8c);
                        auVar126 = vcmpps_avx(auVar77,auVar62,1);
                        auVar71 = vcmpps_avx(auVar62,auVar85,2);
                        auVar126 = vandps_avx(auVar126,auVar71);
                        auVar71 = auVar68 & auVar126;
                        if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar71[0xf] < '\0') {
                          auVar68 = vandps_avx(auVar126,auVar68);
                          auVar126 = vcmpps_avx(auVar119,auVar113,4);
                          auVar71 = auVar126 & auVar68;
                          if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar71 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar71 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar71[0xf] < '\0') {
                            uVar88 = *(uint *)(lVar40 + lVar33 * 4);
                            uVar30 = ((context->scene->geometries).items[uVar88].ptr)->mask;
                            auVar86._4_4_ = uVar30;
                            auVar86._0_4_ = uVar30;
                            auVar86._8_4_ = uVar30;
                            auVar86._12_4_ = uVar30;
                            auVar68 = vandps_avx(auVar68,auVar126);
                            auVar126 = vpand_avx(auVar86,*(undefined1 (*) [16])(ray + 0x90));
                            auVar126 = vpcmpeqd_avx(auVar113,auVar126);
                            auVar71 = auVar68 & ~auVar126;
                            if ((((auVar71 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                 || (auVar71 >> 0x3f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                (auVar71 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || auVar71[0xf] < '\0') {
                              auVar71 = vrcpps_avx(auVar100);
                              auVar115._8_4_ = 0x3f800000;
                              auVar115._0_8_ = 0x3f8000003f800000;
                              auVar115._12_4_ = 0x3f800000;
                              auVar100 = vfnmadd213ps_fma(auVar100,auVar71,auVar115);
                              auVar100 = vfmadd132ps_fma(auVar100,auVar71,auVar71);
                              fVar92 = auVar100._0_4_;
                              auVar87._0_4_ = fVar92 * auVar105._0_4_;
                              fVar122 = auVar100._4_4_;
                              auVar87._4_4_ = fVar122 * auVar105._4_4_;
                              fVar123 = auVar100._8_4_;
                              auVar87._8_4_ = fVar123 * auVar105._8_4_;
                              fVar124 = auVar100._12_4_;
                              auVar87._12_4_ = fVar124 * auVar105._12_4_;
                              auVar100 = vminps_avx(auVar87,auVar115);
                              auVar71 = vsubps_avx(auVar115,auVar100);
                              auVar21._8_8_ = uVar29;
                              auVar21._0_8_ = uVar28;
                              auVar100 = vblendvps_avx(auVar100,auVar71,auVar21);
                              auVar126 = vandnps_avx(auVar126,auVar68);
                              auVar78._0_4_ = auVar145._0_4_ * fVar92;
                              auVar78._4_4_ = auVar145._4_4_ * fVar122;
                              auVar78._8_4_ = auVar145._8_4_ * fVar123;
                              auVar78._12_4_ = auVar145._12_4_ * fVar124;
                              auVar68 = vminps_avx(auVar78,auVar115);
                              auVar71 = vsubps_avx(auVar115,auVar68);
                              auVar71 = vblendvps_avx(auVar68,auVar71,auVar21);
                              auVar63._0_4_ = fVar92 * auVar62._0_4_;
                              auVar63._4_4_ = fVar122 * auVar62._4_4_;
                              auVar63._8_4_ = fVar123 * auVar62._8_4_;
                              auVar63._12_4_ = fVar124 * auVar62._12_4_;
                              uVar31 = *(undefined4 *)((long)&local_1378 + lVar33 * 4);
                              auVar106._4_4_ = uVar31;
                              auVar106._0_4_ = uVar31;
                              auVar106._8_4_ = uVar31;
                              auVar106._12_4_ = uVar31;
                              auVar68 = vmaskmovps_avx(auVar126,auVar63);
                              *(undefined1 (*) [16])pRVar6 = auVar68;
                              auVar68 = vmaskmovps_avx(auVar126,auVar18);
                              *(undefined1 (*) [16])(ray + 0xc0) = auVar68;
                              auVar68 = vmaskmovps_avx(auVar126,auVar47);
                              *(undefined1 (*) [16])(ray + 0xd0) = auVar68;
                              auVar68 = vmaskmovps_avx(auVar126,auVar69);
                              *(undefined1 (*) [16])(ray + 0xe0) = auVar68;
                              auVar68 = vmaskmovps_avx(auVar126,auVar71);
                              *(undefined1 (*) [16])(ray + 0xf0) = auVar68;
                              auVar68 = vmaskmovps_avx(auVar126,auVar100);
                              *(undefined1 (*) [16])(ray + 0x100) = auVar68;
                              auVar68 = vmaskmovps_avx(auVar126,auVar106);
                              *(undefined1 (*) [16])(ray + 0x110) = auVar68;
                              auVar64._4_4_ = uVar88;
                              auVar64._0_4_ = uVar88;
                              auVar64._8_4_ = uVar88;
                              auVar64._12_4_ = uVar88;
                              auVar68 = vmaskmovps_avx(auVar126,auVar64);
                              *(undefined1 (*) [16])(ray + 0x120) = auVar68;
                              uVar30 = context->user->instID[0];
                              auVar65._4_4_ = uVar30;
                              auVar65._0_4_ = uVar30;
                              auVar65._8_4_ = uVar30;
                              auVar65._12_4_ = uVar30;
                              auVar68 = vmaskmovps_avx(auVar126,auVar65);
                              *(undefined1 (*) [16])(ray + 0x130) = auVar68;
                              uVar30 = context->user->instPrimID[0];
                              auVar66._4_4_ = uVar30;
                              auVar66._0_4_ = uVar30;
                              auVar66._8_4_ = uVar30;
                              auVar66._12_4_ = uVar30;
                              auVar68 = vmaskmovps_avx(auVar126,auVar66);
                              *(undefined1 (*) [16])(ray + 0x140) = auVar68;
                            }
                          }
                        }
                      }
                    }
                  }
                  lVar33 = lVar33 + 1;
                } while (lVar33 != 4);
                lVar34 = lVar34 + 1;
                lVar40 = lVar40 + 0xe0;
              } while (lVar34 != uVar32 - 8);
            }
            auVar121 = ZEXT1664(local_10a8);
            auVar67 = vcmpps_avx(*(undefined1 (*) [16])pRVar6,local_10a8,1);
            auVar67 = auVar46 & auVar67;
            if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar67 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar67 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar67[0xf] < '\0') {
              auVar46 = vblendvps_avx(local_10a8,*(undefined1 (*) [16])pRVar6,auVar46);
              auVar121 = ZEXT1664(auVar46);
              auVar67 = vshufps_avx(auVar46,auVar46,0xb1);
              auVar46 = vmaxps_avx(auVar67,auVar46);
              auVar67 = vshufpd_avx(auVar46,auVar46,1);
              local_12c8 = vmaxss_avx(auVar67,auVar46);
            }
          }
        }
        local_1388._4_4_ = local_12c8._0_4_;
        local_1388._0_4_ = local_1388._4_4_;
        fStack_1380 = (float)local_1388._4_4_;
        fStack_137c = (float)local_1388._4_4_;
LAB_0050cc23:
      } while (puVar42 != &local_f78);
    } while (uVar35 != 0);
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersectCoherent(vint<K>* __restrict__ valid_i,
                                                                                                       Accel::Intersectors* __restrict__ This,
                                                                                                       RayHitK<K>& __restrict__ ray,
                                                                                                       RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *(float*)&stackPtr->dist;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active))) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            curDist = pos_inf;
            
#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const vfloat<K> childDist = fmin[i];
                const NodeRef child = node->child(i);
                BVHN<N>::prefetch(child);
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    stackPtr->ptr = cur;
                    *(float*)&stackPtr->dist = toScalar(curDist);
                    stackPtr++;
                  }
                  curDist = childDist;
                  cur = child;
                }
                /* push hit child onto stack */
                else {
                  num_child_hits++;
                  stackPtr->ptr = child;
                  *(float*)&stackPtr->dist = toScalar(childDist);
                  stackPtr++;
                }                
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;

            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (stackPtr[-2].dist < stackPtr[-1].dist)
                std::swap(stackPtr[-2],stackPtr[-1]);
              if (unlikely(num_child_hits >= 3))
              {
                if (stackPtr[-3].dist < stackPtr[-1].dist)
                  std::swap(stackPtr[-3],stackPtr[-1]);
                if (stackPtr[-3].dist < stackPtr[-2].dist)
                  std::swap(stackPtr[-3],stackPtr[-2]);
              }
            }
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);

          /* reduce max distance interval on successful intersection */
          if (likely(any((ray.tfar < tray.tfar) & valid_leaf)))
          {
            tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);
            frustum.template updateMaxDist<K>(tray.tfar);
          }

          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        
      } while(valid_bits);
    }